

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O3

double __thiscall tri_cc_geom_t::get_vert_area(tri_cc_geom_t *this,cellid_t c)

{
  double *pdVar1;
  tri_cc_t *ptVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  ostream *poVar7;
  runtime_error *this_00;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  cellid_t st [40];
  string local_1d8 [32];
  uint local_1b8 [4];
  ostream local_1a8 [376];
  
  ptVar2 = (this->m_tri_cc).px;
  if (ptVar2 != (tri_cc_t *)0x0) {
    uVar6 = tri_cc_t::get_cell_dim(ptVar2,c);
    if (uVar6 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Failed to assert condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"get_cell_dim(c) == 0",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                 ,0x60);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"get_vert_area",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      poVar7 = (ostream *)std::ostream::operator<<(local_1a8,0x289);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1d8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ptVar2 = (this->m_tri_cc).px;
    if (ptVar2 != (tri_cc_t *)0x0) {
      uVar6 = tri_cc_t::get_vert_star(ptVar2,c,(cellid_t *)local_1b8);
      dVar19 = 0.0;
      if (1 < uVar6) {
        uVar10 = 1;
        uVar9 = (ulong)local_1b8[0];
        do {
          iVar8 = (int)uVar9;
          lVar3 = *(long *)&this->m_cell_pos;
          uVar9 = (ulong)(int)local_1b8[uVar10];
          pdVar1 = (double *)(lVar3 + (long)iVar8 * 0x18);
          dVar4 = *pdVar1;
          dVar5 = pdVar1[1];
          pdVar1 = (double *)(lVar3 + (long)c * 0x18);
          dVar16 = *pdVar1;
          dVar17 = pdVar1[1];
          dVar12 = dVar4 - dVar16;
          dVar15 = dVar5 - dVar17;
          dVar11 = *(double *)(lVar3 + 0x10 + (long)iVar8 * 0x18);
          dVar18 = *(double *)(lVar3 + 0x10 + (long)c * 0x18);
          dVar13 = dVar11 - dVar18;
          dVar14 = SQRT(dVar13 * dVar13 + dVar15 * dVar15 + dVar12 * dVar12);
          pdVar1 = (double *)(lVar3 + uVar9 * 0x18);
          dVar13 = *pdVar1;
          dVar15 = pdVar1[1];
          dVar16 = dVar16 - dVar13;
          dVar17 = dVar17 - dVar15;
          dVar12 = *(double *)(lVar3 + 0x10 + uVar9 * 0x18);
          dVar18 = dVar18 - dVar12;
          dVar16 = SQRT(dVar18 * dVar18 + dVar17 * dVar17 + dVar16 * dVar16);
          dVar13 = dVar13 - dVar4;
          dVar15 = dVar15 - dVar5;
          dVar12 = dVar12 - dVar11;
          dVar18 = SQRT(dVar12 * dVar12 + dVar15 * dVar15 + dVar13 * dVar13);
          dVar11 = (dVar14 + dVar16 + dVar18) * 0.5;
          dVar11 = (dVar11 - dVar18) * (dVar11 - dVar16) * (dVar11 - dVar14) * dVar11;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          dVar19 = dVar19 + dVar11;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      return dVar19;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
               );
}

Assistant:

double tri_cc_geom_t::get_vert_area(cellid_t c) const
{
  ASSERT(get_cell_dim(c) == 0);

  double area = 0;

  cellid_t st[40];

  uint st_ct = get_vert_star(c,st);

  for(uint i = 1; i < st_ct; i++)
    area += la::tri_area<double,3>
        (m_cell_pos[st[i-1]],m_cell_pos[c],m_cell_pos[st[i]]);

  return area;
}